

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends,bool buildingIntrinsics)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  char cVar2;
  cmMakefile *this_01;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  bool bVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  const_iterator cVar7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  cmValue cVar10;
  cmFortranSourceInfo *pcVar11;
  cmOutputConverter *this_02;
  string_view source;
  string_view source_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string driver;
  string obj_m;
  string modFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  req;
  string stampFile_1;
  string obj_i;
  undefined1 local_190 [32];
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  char *local_158;
  string local_150;
  cmFortranSourceInfo *local_120;
  string local_118;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [48];
  string local_88;
  cmGlobalGenerator *local_68;
  string *local_60;
  string *local_58;
  string local_50;
  
  local_60 = stamp_dir;
  local_58 = mod_dir;
  cmOutputConverter::MaybeRelativeToTopBinDir
            (&local_50,
             &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator.super_cmOutputConverter,obj);
  cmSystemTools::ConvertToOutputPath(&local_118,&local_50);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (internalDepends,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(info->Source)._M_dataplus._M_p,(info->Source)._M_string_length);
  local_190[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,1);
  local_120 = info;
  if ((info->Includes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_68 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
               super_cmLocalGenerator.GlobalGenerator;
    cVar2 = *(char *)((long)&local_68[1].FindMakeProgramFile._M_string_length + 4);
    if (cVar2 == '\x01') {
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
      local_190[0] = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_190,1);
    }
    p_Var6 = (info->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(info->Includes)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)local_b8,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,(string *)(p_Var6 + 1));
        cmSystemTools::ConvertToOutputPath((string *)local_190,(string *)local_b8);
        if ((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]) != local_b8 + 0x10) {
          operator_delete((undefined1 *)CONCAT71(local_b8._1_7_,local_b8[0]),local_b8._16_8_ + 1);
        }
        if (cVar2 == '\0') {
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_190._0_8_,local_190._8_8_);
          local_b8[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         )0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_b8,1);
        }
        else {
          local_b8[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         )0x20;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (makeDepends,(char *)local_b8,1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_68[1].MakeSilentFlag.field_2.
                                             _M_allocated_capacity,
                              *(long *)((long)&local_68[1].MakeSilentFlag.field_2 + 8));
          local_b8[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         )0x20;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_b8,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,(char *)local_190._0_8_,local_190._8_8_);
        }
        local_b8[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       )0x20;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (internalDepends,(char *)local_b8,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
        local_b8[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       )0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_b8,1);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    }
    local_190[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(makeDepends,local_190,1);
  }
  pcVar11 = local_120;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,&(local_120->Requires)._M_t);
  if (buildingIntrinsics) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)local_b8,
               (pcVar11->Intrinsics)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(pcVar11->Intrinsics)._M_t._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_node_base *)local_b8._24_8_ != (_Rb_tree_node_base *)(local_b8 + 8)) {
    this_00 = &local_120->Provides;
    psVar3 = &local_120->Provides;
    p_Var9 = (_Rb_tree_node_base *)local_b8._24_8_;
    do {
      __k = p_Var9 + 1;
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&this_00->_M_t,(key_type *)__k);
      if ((_Rb_tree_header *)cVar7._M_node == &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(((this->Internal)._M_t.
                          super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                          .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                        TargetRequires)._M_t,(key_type *)__k);
        if (iVar8._M_node ==
            (_Base_ptr)
            ((long)&(((this->Internal)._M_t.
                      super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                      .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl)->
                    TargetRequires)._M_t + 8U)) {
          abort();
        }
        if (iVar8._M_node[2]._M_parent == (_Base_ptr)0x0) {
          local_190._0_8_ = local_190 + 0x10;
          local_190._8_8_ = (pointer)0x0;
          local_190._16_8_ = local_190._16_8_ & 0xffffffffffffff00;
          bVar4 = FindModule(this,(string *)__k,(string *)local_190);
          if (bVar4) {
            cmOutputConverter::MaybeRelativeToTopBinDir
                      (&local_f8,
                       &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                        super_cmLocalGenerator.super_cmOutputConverter,(string *)local_190);
            cmSystemTools::ConvertToOutputPath(&local_150,&local_f8);
            std::__cxx11::string::operator=((string *)local_190,(string *)&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,
                              CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                       local_150.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,(char *)local_190._0_8_,local_190._8_8_);
            local_150._M_dataplus._M_p._0_1_ = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_150,1);
          }
        }
        else {
          cmOutputConverter::MaybeRelativeToTopBinDir
                    (&local_150,
                     &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                      super_cmLocalGenerator.super_cmOutputConverter,(string *)(iVar8._M_node + 2));
          cmSystemTools::ConvertToOutputPath((string *)local_190,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(char *)local_190._0_8_,local_190._8_8_);
          local_150._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_150,1);
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
      }
      p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    } while (p_Var9 != (_Rb_tree_node_base *)(local_b8 + 8));
  }
  if ((local_120->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pcVar11 = (cmFortranSourceInfo *)
              (local_120->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_120 = (cmFortranSourceInfo *)&(local_120->Provides)._M_t._M_impl.super__Rb_tree_header;
    if (pcVar11 != local_120) {
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(this->Internal)._M_t.
                      super___uniq_ptr_impl<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmDependsFortranInternals_*,_std::default_delete<cmDependsFortranInternals>_>
                      .super__Head_base<0UL,_cmDependsFortranInternals_*,_false>._M_head_impl,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pcVar11->Provides);
        local_190._8_8_ = (local_58->_M_dataplus)._M_p;
        local_190._0_8_ = local_58->_M_string_length;
        local_150._M_dataplus._M_p = (char *)0x1;
        local_190._24_8_ = &local_150.field_2;
        local_150.field_2._M_local_buf[0] = '/';
        local_190._16_8_ = 1;
        local_168 = *(undefined8 *)&(pcVar11->Provides)._M_t._M_impl;
        local_170 = *(undefined8 *)&(pcVar11->Provides)._M_t._M_impl.super__Rb_tree_header._M_header
        ;
        views._M_len = 3;
        views._M_array = (iterator)local_190;
        local_150._M_string_length = local_190._24_8_;
        cmCatViews_abi_cxx11_(&local_f8,views);
        this_02 = &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                   super_cmLocalGenerator.super_cmOutputConverter;
        cmOutputConverter::MaybeRelativeToTopBinDir(&local_150,this_02,&local_f8);
        source._M_str = local_150._M_dataplus._M_p;
        source._M_len = local_150._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_190,this_02,source,SHELL);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        local_190._8_8_ = (local_60->_M_dataplus)._M_p;
        local_190._0_8_ = local_60->_M_string_length;
        local_150._M_dataplus._M_p = (char *)0x1;
        local_190._24_8_ = &local_150.field_2;
        local_150.field_2._M_local_buf[0] = '/';
        local_190._16_8_ = 1;
        local_168 = *(undefined8 *)&(pcVar11->Provides)._M_t._M_impl;
        local_170 = *(undefined8 *)&(pcVar11->Provides)._M_t._M_impl.super__Rb_tree_header._M_header
        ;
        local_160 = 6;
        local_158 = ".stamp";
        views_00._M_len = 4;
        views_00._M_array = (iterator)local_190;
        local_150._M_string_length = local_190._24_8_;
        cmCatViews_abi_cxx11_(&local_88,views_00);
        cmOutputConverter::MaybeRelativeToTopBinDir
                  ((string *)local_190,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,&local_88);
        std::__cxx11::string::operator=((string *)&local_88,(string *)local_190);
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        source_00._M_str = local_88._M_dataplus._M_p;
        source_00._M_len = local_88._M_string_length;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_190,
                   &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                    super_cmLocalGenerator.super_cmOutputConverter,source_00,SHELL);
        cmSystemTools::ConvertToOutputPath(&local_150,&local_88);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".provides.build",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_150._M_dataplus._M_p,local_150._M_string_length);
        local_d8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_d8,1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_150._M_dataplus._M_p,local_150._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
        local_d8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_d8,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ",0x28);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_f8._M_dataplus._M_p,local_f8._M_string_length);
        local_d8._M_dataplus._M_p._0_1_ = 0x20;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_d8,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,(char *)local_190._0_8_,local_190._8_8_);
        this_01 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                  super_cmLocalGenerator.Makefile;
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"CMAKE_Fortran_COMPILER_ID","");
        cVar10 = cmMakefile::GetDefinition(this_01,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((cVar10.Value != (string *)0x0) && ((cVar10.Value)->_M_string_length != 0)) {
          local_d8._M_dataplus._M_p._0_1_ = 0x20;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (makeDepends,(char *)&local_d8,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,((cVar10.Value)->_M_dataplus)._M_p,(cVar10.Value)->_M_string_length);
        }
        local_d8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(makeDepends,(char *)&local_d8,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pcVar11 = (cmFortranSourceInfo *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar11);
      } while (pcVar11 != local_120);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".provides.build:\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (makeDepends,"\t$(CMAKE_COMMAND) -E touch ",0x1b);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".provides.build\n",0x10);
    local_190._8_8_ = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    local_190._0_8_ = (this->super_cmDepends).TargetDirectory._M_string_length;
    local_190._16_8_ = 6;
    local_190._24_8_ = "/build";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_190;
    cmCatViews_abi_cxx11_(&local_150,views_01);
    cmOutputConverter::MaybeRelativeToTopBinDir
              (&local_f8,
               &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                super_cmLocalGenerator.super_cmOutputConverter,&local_150);
    cmSystemTools::ConvertToOutputPath((string *)local_190,&local_f8);
    std::__cxx11::string::operator=((string *)&local_150,(string *)local_190);
    if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_150._M_dataplus._M_p,local_150._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".provides.build\n",0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                               local_150.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends,
                                             bool buildingIntrinsics)
{
  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << "\n " << src << '\n';
  if (!info.Includes.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& i : info.Includes) {
      std::string dependee = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(i));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << i << '\n';
    }
    makeDepends << '\n';
  }

  std::set<std::string> req = info.Requires;
  if (buildingIntrinsics) {
    req.insert(info.Intrinsics.begin(), info.Intrinsics.end());
  }

  // Write module requirements to the output stream.
  for (std::string const& i : req) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    auto required = this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(required->second));
      makeDepends << obj_m << ": " << stampFile << '\n';
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->LocalGenerator->MaybeRelativeToTopBinDir(module));
        makeDepends << obj_m << ": " << module << '\n';
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = cmStrCat(mod_dir, '/', i);
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->LocalGenerator->MaybeRelativeToTopBinDir(modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = cmStrCat(stamp_dir, '/', i, ".stamp");
      stampFile = this->LocalGenerator->MaybeRelativeToTopBinDir(stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << '\n';
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << '\n';
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << ' ' << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      cmValue cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cmNonempty(cid)) {
        makeDepends << ' ' << *cid;
      }
      makeDepends << '\n';
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = cmStrCat(this->TargetDirectory, "/build");
    driver = cmSystemTools::ConvertToOutputPath(
      this->LocalGenerator->MaybeRelativeToTopBinDir(driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}